

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O1

void __thiscall duckdb::ZstdStreamWrapper::FlushStream(ZstdStreamWrapper *this)

{
  CompressedFile *pCVar1;
  _Head_base<0UL,_unsigned_char_*,_false> buffer;
  uint uVar2;
  size_t code;
  data_ptr_t pdVar3;
  pointer this_00;
  IOException *this_01;
  char *pcVar4;
  ZSTD_outBuffer out_buffer;
  allocator local_81;
  ZSTD_outBuffer local_80;
  string local_68;
  ZSTD_inBuffer local_48;
  
  pCVar1 = this->file;
  local_48.src = (void *)0x0;
  local_48.size = 0;
  local_48.pos = 0;
  do {
    local_80.dst = (pCVar1->stream_data).out_buff_start;
    local_80.size =
         (long)(pCVar1->stream_data).out_buff.
               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
         ((pCVar1->stream_data).out_buf_size - (long)local_80.dst);
    local_80.pos = 0;
    code = duckdb_zstd::ZSTD_compressStream2(this->zstd_compress_ptr,&local_80,&local_48,ZSTD_e_end)
    ;
    uVar2 = duckdb_zstd::ZSTD_isError(code);
    if (uVar2 != 0) {
      this_01 = (IOException *)__cxa_allocate_exception(0x10);
      pcVar4 = duckdb_zstd::ZSTD_getErrorName(code);
      ::std::__cxx11::string::string((string *)&local_68,pcVar4,&local_81);
      IOException::IOException(this_01,&local_68);
      __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pdVar3 = (pCVar1->stream_data).out_buff_start + local_80.pos;
    (pCVar1->stream_data).out_buff_start = pdVar3;
    if ((pCVar1->stream_data).out_buff.
        super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl < pdVar3) {
      this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                operator->(&this->file->child_handle);
      buffer._M_head_impl =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      FileHandle::Write(this_00,buffer._M_head_impl,
                        (long)(pCVar1->stream_data).out_buff_start - (long)buffer._M_head_impl);
      (pCVar1->stream_data).out_buff_start =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
  } while (code != 0);
  return;
}

Assistant:

void ZstdStreamWrapper::FlushStream() {
	auto &sd = file->stream_data;
	duckdb_zstd::ZSTD_inBuffer in_buffer;
	duckdb_zstd::ZSTD_outBuffer out_buffer;

	in_buffer.src = nullptr;
	in_buffer.size = 0;
	in_buffer.pos = 0;
	while (true) {
		idx_t output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;

		out_buffer.dst = sd.out_buff_start;
		out_buffer.size = output_remaining;
		out_buffer.pos = 0;

		auto res =
		    duckdb_zstd::ZSTD_compressStream2(zstd_compress_ptr, &out_buffer, &in_buffer, duckdb_zstd::ZSTD_e_end);
		if (duckdb_zstd::ZSTD_isError(res)) {
			throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
		}
		idx_t written_to_output = out_buffer.pos;
		sd.out_buff_start += written_to_output;
		if (sd.out_buff_start > sd.out_buff.get()) {
			file->child_handle->Write(sd.out_buff.get(), sd.out_buff_start - sd.out_buff.get());
			sd.out_buff_start = sd.out_buff.get();
		}
		if (res == 0) {
			break;
		}
	}
}